

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

void glfwGetCursorPos(GLFWwindow *handle,double *xpos,double *ypos)

{
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  _GLFWwindow *window;
  _GLFWwindow *in_stack_00000028;
  
  if (in_RSI != (undefined8 *)0x0) {
    *in_RSI = 0;
  }
  if (in_RDX != (undefined8 *)0x0) {
    *in_RDX = 0;
  }
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
  }
  else if (*(int *)(in_RDI + 0x7c) == 0x34003) {
    if (in_RSI != (undefined8 *)0x0) {
      *in_RSI = *(undefined8 *)(in_RDI + 0x1e8);
    }
    if (in_RDX != (undefined8 *)0x0) {
      *in_RDX = *(undefined8 *)(in_RDI + 0x1f0);
    }
  }
  else {
    _glfwPlatformGetCursorPos(in_stack_00000028,(double *)handle,xpos);
  }
  return;
}

Assistant:

GLFWAPI void glfwGetCursorPos(GLFWwindow* handle, double* xpos, double* ypos)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    if (xpos)
        *xpos = 0;
    if (ypos)
        *ypos = 0;

    _GLFW_REQUIRE_INIT();

    if (window->cursorMode == GLFW_CURSOR_DISABLED)
    {
        if (xpos)
            *xpos = window->virtualCursorPosX;
        if (ypos)
            *ypos = window->virtualCursorPosY;
    }
    else
        _glfwPlatformGetCursorPos(window, xpos, ypos);
}